

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,int nSubquery)

{
  Expr *zC;
  char *in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  sqlite3 *db;
  Expr *pDup;
  Expr *pOrig;
  Expr temp;
  Expr *in_stack_ffffffffffffff68;
  sqlite3 *db_00;
  sqlite3 *db_01;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db_01 = *(sqlite3 **)(in_RSI + 8 + (long)in_EDX * 0x18);
  if (*(long *)(in_RCX + 0x38) == 0) {
    db_00 = (sqlite3 *)*in_RDI;
    zC = sqlite3ExprDup(db_01,(Expr *)&DAT_aaaaaaaaaaaaaaaa,(int)((ulong)db_00 >> 0x20));
    if (db_00->mallocFailed == '\0') {
      memset(local_50,0xaa,0x48);
      incrAggFunctionDepth(in_stack_ffffffffffffff68,0);
      if (*in_RCX == 'r') {
        zC = sqlite3ExprAddCollateString
                       ((Parse *)CONCAT44(in_R8D,in_stack_ffffffffffffff88),(Expr *)db_01,(char *)zC
                       );
      }
      memcpy(local_50,zC,0x48);
      memcpy(zC,in_RCX,0x48);
      memcpy(in_RCX,local_50,0x48);
      if (((*(uint *)(in_RCX + 4) & 0x1000000) != 0) && (*(long *)(in_RCX + 0x40) != 0)) {
        *(char **)(*(long *)(in_RCX + 0x40) + 0x70) = in_RCX;
      }
      sqlite3ExprDeferredDelete((Parse *)db_00,in_stack_ffffffffffffff68);
    }
    else {
      sqlite3ExprDelete(db_00,in_stack_ffffffffffffff68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  assert( !ExprHasProperty(pExpr, EP_Reduced|EP_TokenOnly) );
  if( pExpr->pAggInfo ) return;
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( db->mallocFailed ){
    sqlite3ExprDelete(db, pDup);
    pDup = 0;
  }else{
    Expr temp;
    incrAggFunctionDepth(pDup, nSubquery);
    if( pExpr->op==TK_COLLATE ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
    }
    memcpy(&temp, pDup, sizeof(Expr));
    memcpy(pDup, pExpr, sizeof(Expr));
    memcpy(pExpr, &temp, sizeof(Expr));
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      if( ALWAYS(pExpr->y.pWin!=0) ){
        pExpr->y.pWin->pOwner = pExpr;
      }
    }
    sqlite3ExprDeferredDelete(pParse, pDup);
  }
}